

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

string * __thiscall
embree::ParseLocation::str_abi_cxx11_(string *__return_storage_ptr__,ParseLocation *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"unknown",(allocator *)&local_50);
  if ((this->fileName).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if (-1 < this->lineNumber) {
    std::__cxx11::to_string(&local_30,this->lineNumber);
    std::operator+(&local_50," line ",&local_30);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    if ((-1 < this->lineNumber) && (-1 < this->colNumber)) {
      std::__cxx11::to_string(&local_30,this->colNumber);
      std::operator+(&local_50," character ",&local_30);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
      std::string str = "unknown";
      if (fileName) str = *fileName;
      if (lineNumber >= 0) str += " line " + toString(lineNumber);
      if (lineNumber >= 0 && colNumber >= 0) str += " character " + toString(colNumber);
      return str;
    }